

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool ParseInt(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  StreamIn *in;
  uint c;
  Bool BVar1;
  uint uVar2;
  Bool BVar3;
  ulong val;
  
  c = SkipWhite(&doc->config);
  BVar1 = prvTidyIsDigit(c);
  if (BVar1 == no) {
    BVar3 = no;
    val = 0;
  }
  else {
    val = 0;
    do {
      if ((doc->config).c != 0xffffffff) {
        in = (doc->config).cfgIn;
        if (in == (StreamIn *)0x0) {
          uVar2 = 0xffffffff;
        }
        else {
          uVar2 = prvTidyReadChar(in);
        }
        (doc->config).c = uVar2;
      }
      val = (ulong)(c - 0x30) + val * 10;
      c = (doc->config).c;
      BVar3 = prvTidyIsDigit(c);
    } while (BVar3 != no);
    BVar3 = yes;
  }
  if (BVar1 == no) {
    prvTidyReportBadArgument(doc,entry->name);
  }
  else {
    prvTidySetOptionInt(doc,entry->id,val);
  }
  return BVar3;
}

Assistant:

Bool ParseInt( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    ulong number = 0;
    Bool digits = no;
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );

    while ( TY_(IsDigit)(c) )
    {
        number = c - '0' + (10 * number);
        digits = yes;
        c = AdvanceChar( cfg );
    }

    if ( !digits )
        TY_(ReportBadArgument)( doc, entry->name );
    else
        TY_(SetOptionInt)( doc, entry->id, number );
    return digits;
}